

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

ZoneState *
QDateTimePrivate::localStateAtMillis
          (ZoneState *__return_storage_ptr__,qint64 millis,TransitionOptions resolve)

{
  bool bVar1;
  long local;
  long lVar2;
  R_conflict5 RVar3;
  
  bVar1 = millisInSystemRange(millis,86400000);
  if (bVar1) {
    *(undefined1 **)&__return_storage_ptr__->valid = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->when = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&__return_storage_ptr__->offset = &DAT_aaaaaaaaaaaaaaaa;
    QLocalTime::mapLocalTime(__return_storage_ptr__,millis,resolve);
    if (__return_storage_ptr__->valid != false) {
      return __return_storage_ptr__;
    }
  }
  RVar3 = millisToWithinRange(millis);
  local = RVar3.shifted;
  if (((undefined1  [16])RVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __return_storage_ptr__->when = millis;
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->dst = UnknownDaylightTime;
    __return_storage_ptr__->valid = false;
  }
  else {
    *(undefined1 **)&__return_storage_ptr__->valid = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->when = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&__return_storage_ptr__->offset = &DAT_aaaaaaaaaaaaaaaa;
    QLocalTime::mapLocalTime(__return_storage_ptr__,local,resolve);
    if (__return_storage_ptr__->valid == true) {
      lVar2 = (millis - local) + __return_storage_ptr__->when;
      if ((SCARRY8(millis - local,__return_storage_ptr__->when)) &&
         (lVar2 = -0x8000000000000000, local <= millis)) {
        lVar2 = 0x7fffffffffffffff;
      }
      __return_storage_ptr__->when = lVar2;
    }
    else {
      __return_storage_ptr__->when = millis;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QDateTimePrivate::ZoneState QDateTimePrivate::localStateAtMillis(
    qint64 millis, QDateTimePrivate::TransitionOptions resolve)
{
    // First, if millis is within a day of the viable range, try mktime() in
    // case it does fall in the range and gets useful information:
    if (millisInSystemRange(millis, MSECS_PER_DAY)) {
        auto result = QLocalTime::mapLocalTime(millis, resolve);
        if (result.valid)
            return result;
    }

    // Otherwise, outside the system range.
#if QT_CONFIG(timezone)
    // Use the system zone:
    const auto sys = QTimeZone::systemTimeZone();
    if (sys.isValid())
        return zoneStateAtMillis(sys, millis, resolve);
#endif // timezone

    // Kludge
    // Use a time in the system range with the same day-of-week pattern to its year:
    auto fake = millisToWithinRange(millis);
    if (Q_LIKELY(fake.good)) {
        auto result = QLocalTime::mapLocalTime(fake.shifted, resolve);
        if (result.valid) {
            qint64 adjusted;
            if (Q_UNLIKELY(qAddOverflow(result.when, millis - fake.shifted, &adjusted))) {
                using Bound = std::numeric_limits<qint64>;
                adjusted = millis < fake.shifted ? Bound::min() : Bound::max();
            }
            result.when = adjusted;
        } else {
            result.when = millis;
        }
        return result;
    }
    // Overflow, apparently.
    return {millis};
}